

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.h
# Opt level: O2

int __thiscall
CLogarithmicScrollbarScale::ToAbsolute
          (CLogarithmicScrollbarScale *this,float RelativeValue,int Min,int Max)

{
  int iVar1;
  __type _Var2;
  __type _Var3;
  __type _Var4;
  double dVar5;
  
  iVar1 = 0;
  if (Min < this->m_MinAdjustment) {
    iVar1 = this->m_MinAdjustment;
  }
  _Var2 = std::log<int>(Max + iVar1);
  _Var3 = std::log<int>(Min + iVar1);
  _Var4 = std::log<int>(Min + iVar1);
  dVar5 = exp(_Var4 + (_Var2 - _Var3) * (double)RelativeValue);
  return (int)((float)dVar5 + *(float *)(&DAT_001ca96c + (ulong)(0.0 < (float)dVar5) * 4)) - iVar1;
}

Assistant:

int ToAbsolute(float RelativeValue, int Min, int Max) const
	{
		int ResultAdjustment = 0;
		if(Min < m_MinAdjustment)
		{
			Min += m_MinAdjustment;
			Max += m_MinAdjustment;
			ResultAdjustment = -m_MinAdjustment;
		}
		return round_to_int(exp(RelativeValue*(log(Max) - log(Min)) + log(Min))) + ResultAdjustment;
	}